

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_swap(Tree *this,size_t n_,size_t m_)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  size_t sVar6;
  NodeType NVar7;
  NodeType NVar8;
  csubstr cVar9;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char msg [59];
  
  sVar6 = parent(this,n_);
  if ((sVar6 == 0xffffffffffffffff) && (NVar7 = type(this,n_), NVar7.type != NOTYPE)) {
    builtin_strncpy(msg + 0x30,"== NOTYPE)",0xb);
    builtin_strncpy(msg + 0x20,"NE) || type(n_) ",0x10);
    builtin_strncpy(msg + 0x10,"parent(n_) != NO",0x10);
    builtin_strncpy(msg,"check failed: ((",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_70 = cVar9.len;
    pcStack_78 = cVar9.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6447) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6447) << 0x40,8);
    LVar3.name.str = pcStack_78;
    LVar3.name.len = local_70;
    (*p_Var1)(msg,0x3b,LVar3,(this->m_callbacks).m_user_data);
  }
  sVar6 = parent(this,m_);
  if ((sVar6 == 0xffffffffffffffff) && (NVar7 = type(this,m_), NVar7.type != NOTYPE)) {
    builtin_strncpy(msg + 0x30,"== NOTYPE)",0xb);
    builtin_strncpy(msg + 0x20,"NE) || type(m_) ",0x10);
    builtin_strncpy(msg + 0x10,"parent(m_) != NO",0x10);
    builtin_strncpy(msg,"check failed: ((",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_98 = cVar9.len;
    pcStack_a0 = cVar9.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6448) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6448) << 0x40,8);
    LVar4.name.str = pcStack_a0;
    LVar4.name.len = local_98;
    (*p_Var1)(msg,0x3b,LVar4,(this->m_callbacks).m_user_data);
  }
  NVar7 = type(this,n_);
  NVar8 = type(this,m_);
  if (NVar7.type == NOTYPE) {
    if (NVar8.type == NOTYPE) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      handle_error(0x1fb453,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x6462);
    }
    _copy_props(this,n_,m_);
    _free_list_rem(this,n_);
    _copy_hierarchy(this,n_,m_);
    _clear(this,m_);
    n_ = m_;
  }
  else {
    if (NVar8.type != NOTYPE) {
      _swap_props(this,n_,m_);
      _swap_hierarchy(this,n_,m_);
      return;
    }
    _copy_props(this,m_,n_);
    _free_list_rem(this,m_);
    _copy_hierarchy(this,m_,n_);
    _clear(this,n_);
  }
  _free_list_add(this,n_);
  return;
}

Assistant:

void Tree::_swap(size_t n_, size_t m_)
{
    _RYML_CB_ASSERT(m_callbacks, (parent(n_) != NONE) || type(n_) == NOTYPE);
    _RYML_CB_ASSERT(m_callbacks, (parent(m_) != NONE) || type(m_) == NOTYPE);
    NodeType tn = type(n_);
    NodeType tm = type(m_);
    if(tn != NOTYPE && tm != NOTYPE)
    {
        _swap_props(n_, m_);
        _swap_hierarchy(n_, m_);
    }
    else if(tn == NOTYPE && tm != NOTYPE)
    {
        _copy_props(n_, m_);
        _free_list_rem(n_);
        _copy_hierarchy(n_, m_);
        _clear(m_);
        _free_list_add(m_);
    }
    else if(tn != NOTYPE && tm == NOTYPE)
    {
        _copy_props(m_, n_);
        _free_list_rem(m_);
        _copy_hierarchy(m_, n_);
        _clear(n_);
        _free_list_add(n_);
    }
    else
    {
        C4_NEVER_REACH();
    }
}